

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

int Ssw_SmlCountXorImplication(Ssw_Sml_t *p,Aig_Obj_t *pObjLi,Aig_Obj_t *pObjLo,Aig_Obj_t *pCand)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  if ((pObjLo->field_0x18 & 8) != 0) {
    __assert_fail("pObjLo->fPhase == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0xf1,
                  "int Ssw_SmlCountXorImplication(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)"
                 );
  }
  iVar4 = p->nWordsTotal;
  lVar1 = (long)(*(int *)(((ulong)pCand & 0xfffffffffffffffe) + 0x24) * iVar4) * 4;
  lVar2 = (long)(pObjLi->Id * iVar4) * 4;
  lVar3 = (long)(pObjLo->Id * iVar4) * 4;
  iVar6 = p->nWordsPref;
  lVar7 = (long)iVar6;
  if ((((uint)pCand ^ *(uint *)(((ulong)pCand & 0xfffffffffffffffe) + 0x18) >> 3) & 1) == 0) {
    if (iVar6 < iVar4) {
      iVar6 = 0;
      do {
        uVar5 = ~(*(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar2) ^
                 *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar3)) &
                *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar1);
        uVar5 = (uVar5 >> 1 & 0x55555555) + (uVar5 & 0x55555555);
        uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
        uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
        uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
        iVar6 = (uVar5 >> 0x10) + iVar6 + (uVar5 & 0xffff);
        lVar7 = lVar7 + 1;
      } while (iVar4 != lVar7);
      return iVar6;
    }
  }
  else if (iVar6 < iVar4) {
    iVar6 = 0;
    do {
      uVar5 = ~(*(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar3) ^
                *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar2) |
               *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar1));
      uVar5 = (uVar5 >> 1 & 0x55555555) + (uVar5 & 0x55555555);
      uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
      uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
      uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
      iVar6 = (uVar5 >> 0x10) + iVar6 + (uVar5 & 0xffff);
      lVar7 = lVar7 + 1;
    } while (iVar4 != lVar7);
    return iVar6;
  }
  return 0;
}

Assistant:

int Ssw_SmlCountXorImplication( Ssw_Sml_t * p, Aig_Obj_t * pObjLi, Aig_Obj_t * pObjLo, Aig_Obj_t * pCand )
{
    unsigned * pSimLi, * pSimLo, * pSimCand;
    int k, Counter = 0;
    assert( pObjLo->fPhase == 0 );
    // pObjLi->fPhase may be 1, but the LI simulation data is not complemented!
    pSimCand = Ssw_ObjSim( p, Aig_Regular(pCand)->Id );
    pSimLi   = Ssw_ObjSim( p, pObjLi->Id );
    pSimLo   = Ssw_ObjSim( p, pObjLo->Id );
    if ( Aig_Regular(pCand)->fPhase ^ Aig_IsComplement(pCand) )
    {
        for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
            Counter += Aig_WordCountOnes(~pSimCand[k] & ~(pSimLi[k] ^ pSimLo[k]));
    }
    else
    {
        for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
            Counter += Aig_WordCountOnes(pSimCand[k] & ~(pSimLi[k] ^ pSimLo[k]));
    }
    return Counter;
}